

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint64 ma_dr_wav_read_pcm_frames_s16be
                    (ma_dr_wav *pWav,ma_uint64 framesToRead,ma_int16 *pBufferOut)

{
  ushort *puVar1;
  ushort uVar2;
  ma_uint64 mVar3;
  long lVar4;
  
  mVar3 = ma_dr_wav_read_pcm_frames_s16(pWav,framesToRead,pBufferOut);
  if (pBufferOut != (ma_int16 *)0x0) {
    uVar2 = pWav->channels;
    for (lVar4 = 0; mVar3 * uVar2 - lVar4 != 0; lVar4 = lVar4 + 1) {
      puVar1 = (ushort *)(pBufferOut + lVar4);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    }
  }
  return mVar3;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_s16be(ma_dr_wav* pWav, ma_uint64 framesToRead, ma_int16* pBufferOut)
{
    ma_uint64 framesRead = ma_dr_wav_read_pcm_frames_s16(pWav, framesToRead, pBufferOut);
    if (pBufferOut != NULL && ma_dr_wav__is_little_endian() == MA_TRUE) {
        ma_dr_wav__bswap_samples_s16(pBufferOut, framesRead*pWav->channels);
    }
    return framesRead;
}